

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

ostream * pstack::Procman::operator<<(ostream *os,SigInfo *sip)

{
  allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
  *this;
  initializer_list<std::pair<const_int,_const_char_*>_> __l;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_00;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_01;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_02;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_03;
  initializer_list<std::pair<const_int,_const_char_*>_> __l_04;
  initializer_list<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
  __l_05;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer ppVar5;
  pointer ppVar6;
  void *pvVar7;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  *local_858;
  _Self local_7c8;
  _Self local_7c0;
  iterator code;
  key_type local_7ac;
  _Base_ptr local_7a8;
  _Self local_7a0;
  _Self local_798;
  iterator codesforsig;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_788;
  int local_750;
  allocator<std::pair<const_int,_const_char_*>_> local_74a;
  less<int> local_749;
  pair<const_int,_const_char_*> local_748;
  undefined8 local_738;
  char *pcStack_730;
  undefined8 local_728;
  char *pcStack_720;
  undefined8 local_718;
  char *pcStack_710;
  undefined8 local_708;
  char *pcStack_700;
  iterator local_6f0;
  size_type local_6e8;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_6e0;
  int local_6b0;
  allocator<std::pair<const_int,_const_char_*>_> local_6aa;
  less<int> local_6a9;
  pair<const_int,_const_char_*> local_6a8;
  undefined8 local_698;
  char *pcStack_690;
  undefined8 local_688;
  char *pcStack_680;
  undefined8 local_678;
  char *pcStack_670;
  undefined8 local_668;
  char *pcStack_660;
  iterator local_658;
  size_type local_650;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_648;
  int local_618;
  allocator<std::pair<const_int,_const_char_*>_> local_612;
  less<int> local_611;
  pair<const_int,_const_char_*> local_610 [10];
  iterator local_570;
  size_type local_568;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_560;
  int local_530;
  allocator<std::pair<const_int,_const_char_*>_> local_52a;
  less<int> local_529;
  pair<const_int,_const_char_*> local_528 [9];
  iterator local_498;
  size_type local_490;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_488;
  int local_458;
  allocator<std::pair<const_int,_const_char_*>_> local_452;
  less<int> local_451;
  pair<const_int,_const_char_*> local_450 [16];
  iterator local_350;
  size_type local_348;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_340;
  int local_310 [5];
  allocator<std::pair<const_int,_const_char_*>_> local_2fa;
  less<int> local_2f9;
  pair<const_int,_const_char_*> local_2f8;
  undefined8 local_2e8;
  char *pcStack_2e0;
  undefined8 local_2d8;
  char *pcStack_2d0;
  undefined8 local_2c8;
  char *pcStack_2c0;
  undefined8 local_2b8;
  char *pcStack_2b0;
  undefined8 local_2a8;
  char *pcStack_2a0;
  undefined8 local_298;
  char *pcStack_290;
  iterator local_280;
  size_type local_278;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  local_270;
  int local_23c;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  *local_238;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_230;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_1f8;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_1c0;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_188;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_150;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_118;
  pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
  local_e0;
  iterator local_a8;
  size_type local_a0;
  _Rb_tree_color local_98 [2];
  siginfo_t si;
  SigInfo *sip_local;
  ostream *os_local;
  
  si._sifields._104_8_ = sip;
  memcpy(local_98,sip->si,0x80);
  if ((operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes == '\0') &&
     (iVar2 = __cxa_guard_acquire(&operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes)
     , iVar2 != 0)) {
    codesforsig._M_node._7_1_ = 1;
    local_238 = &local_230;
    local_23c = 0xb;
    local_298 = 8;
    pcStack_290 = "asynchronous ARM MTE error";
    local_2a8 = 7;
    pcStack_2a0 = "precise MCD exception";
    local_2b8 = 6;
    pcStack_2b0 = "disrupting MCD error";
    local_2c8 = 5;
    pcStack_2c0 = "ADI not enabled";
    local_2d8 = 3;
    pcStack_2d0 = "address failed bouds checks";
    local_2e8 = 2;
    pcStack_2e0 = "invalid permissions for mapped object";
    local_2f8.first = 1;
    local_2f8._4_4_ = 0;
    local_2f8.second = "address not mapped to object";
    local_280 = &local_2f8;
    local_278 = 7;
    std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_2fa);
    __l_04._M_len = local_278;
    __l_04._M_array = local_280;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_270,__l_04,&local_2f9,&local_2fa);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_230,&local_23c,&local_270);
    local_310[0] = 0;
    local_238 = &local_1f8;
    memcpy(local_450,&DAT_001f77c8,0x100);
    local_348 = 0x10;
    local_350 = local_450;
    std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_452);
    __l_03._M_len = local_348;
    __l_03._M_array = local_350;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_340,__l_03,&local_451,&local_452);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_1f8,local_310,&local_340);
    local_458 = 4;
    local_238 = &local_1c0;
    memcpy(local_528,&DAT_001f78c8,0x90);
    local_490 = 9;
    local_498 = local_528;
    std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_52a);
    __l_02._M_len = local_490;
    __l_02._M_array = local_498;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_488,__l_02,&local_529,&local_52a);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_1c0,&local_458,&local_488);
    local_530 = 8;
    local_238 = &local_188;
    memcpy(local_610,&DAT_001f7958,0xa0);
    local_568 = 10;
    local_570 = local_610;
    std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_612);
    __l_01._M_len = local_568;
    __l_01._M_array = local_570;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_560,__l_01,&local_611,&local_612);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_188,&local_530,&local_560);
    local_618 = 7;
    local_668 = 5;
    pcStack_660 = "hardware memory error consumed on a machine check: action optional";
    local_678 = 4;
    pcStack_670 = "hardware memory error consumed on a machine check: action required";
    local_688 = 3;
    pcStack_680 = "object specific hardware error";
    local_698 = 2;
    pcStack_690 = "non-existent physical address";
    local_6a8.first = 1;
    local_6a8._4_4_ = 0;
    local_6a8.second = "invalid address alignment";
    local_658 = &local_6a8;
    local_650 = 5;
    local_238 = &local_150;
    std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_6aa);
    __l_00._M_len = local_650;
    __l_00._M_array = local_658;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_648,__l_00,&local_6a9,&local_6aa);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_150,&local_618,&local_648);
    local_6b0 = 5;
    local_708 = 5;
    pcStack_700 = "undiagnosed trap";
    local_718 = 4;
    pcStack_710 = "hardware breakpoint/watchpoint";
    local_728 = 3;
    pcStack_720 = "process taken branch trap";
    local_738 = 2;
    pcStack_730 = "process trace trap";
    local_748.first = 1;
    local_748._4_4_ = 0;
    local_748.second = "process breakpoint";
    local_6f0 = &local_748;
    local_6e8 = 5;
    local_238 = &local_118;
    std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_74a);
    __l._M_len = local_6e8;
    __l._M_array = local_6f0;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_6e0,__l,&local_749,&local_74a);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_118,&local_6b0,&local_6e0);
    local_750 = 0x1f;
    local_788._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_788._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_788._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_788._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_788._M_t._M_impl._0_8_ = 0;
    local_788._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_788._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_238 = &local_e0;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&local_788);
    std::
    pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
    ::pair<int,_true>(&local_e0,&local_750,&local_788);
    codesforsig._M_node._7_1_ = 0;
    local_a8 = &local_230;
    local_a0 = 7;
    this = (allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
            *)((long)&codesforsig._M_node + 5);
    std::
    allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
    ::allocator(this);
    __l_05._M_len = local_a0;
    __l_05._M_array = local_a8;
    std::
    map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
    ::map(&operator<<::codes,__l_05,(less<int> *)((long)&codesforsig._M_node + 6),this);
    std::
    allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
    ::~allocator((allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
                  *)((long)&codesforsig._M_node + 5));
    local_858 = (pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
                 *)&local_a8;
    do {
      local_858 = local_858 + -1;
      std::
      pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>
      ::~pair(local_858);
    } while (local_858 != &local_230);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_788);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_6e0);
    std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_74a);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_648);
    std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_6aa);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_560);
    std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_612);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_488);
    std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_52a);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_340);
    std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_452);
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    ~map(&local_270);
    std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_2fa);
    __cxa_atexit(std::
                 map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
                 ::~map,&operator<<::codes,&__dso_handle);
    __cxa_guard_release(&operator<<(std::ostream&,pstack::Procman::SigInfo_const&)::codes);
  }
  pcVar3 = (char *)sigdescr_np(local_98[0]);
  poVar4 = std::operator<<(os,pcVar3);
  poVar4 = std::operator<<(poVar4," SIG");
  pcVar3 = (char *)sigabbrev_np(local_98[0]);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,", si_code ");
  std::ostream::operator<<(poVar4,si.si_signo);
  local_798._M_node =
       (_Base_ptr)
       std::
       map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
       ::find(&operator<<::codes,(key_type *)local_98);
  local_7a0._M_node =
       (_Base_ptr)
       std::
       map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
       ::end(&operator<<::codes);
  bVar1 = std::operator==(&local_798,&local_7a0);
  if (bVar1) {
    local_7ac = 0;
    local_7a8 = (_Base_ptr)
                std::
                map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
                ::find(&operator<<::codes,&local_7ac);
    local_798._M_node = local_7a8;
  }
  code._M_node = (_Base_ptr)
                 std::
                 map<int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>_>
                 ::end(&operator<<::codes);
  bVar1 = std::operator==(&local_798,(_Self *)&code);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
             ::operator->(&local_798);
    local_7c0._M_node =
         (_Base_ptr)
         std::
         map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         ::find(&ppVar5->second,&si.si_signo);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>_>_>
             ::operator->(&local_798);
    local_7c8._M_node =
         (_Base_ptr)
         std::
         map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
         ::end(&ppVar5->second);
    bVar1 = std::operator==(&local_7c0,&local_7c8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = std::operator<<(os," - ");
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_const_char_*>_>::operator->(&local_7c0);
      std::operator<<(poVar4,ppVar6->second);
    }
  }
  if (((local_98[0] - 4 < 2) || (local_98[0] - 7 < 2)) || (local_98[0] == 0xb)) {
    poVar4 = std::operator<<(os,", fault address ");
    pvVar7 = (void *)std::ostream::operator<<(poVar4,std::hex);
    pvVar7 = (void *)std::ostream::operator<<(pvVar7,(void *)si._8_8_);
    std::ostream::operator<<(pvVar7,std::dec);
  }
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, const SigInfo &sip) {
   const auto si = sip.si;

   static std::map<int, std::map<int, const char *>> codes {
         { SIGSEGV,  {
                     { SEGV_MAPERR, "address not mapped to object" },
                        { SEGV_ACCERR, "invalid permissions for mapped object" },
                        { SEGV_BNDERR, "address failed bouds checks" },
                        { SEGV_ACCADI, "ADI not enabled" },
                        { SEGV_ADIDERR, "disrupting MCD error" },
                        { SEGV_ADIPERR, "precise MCD exception" },
                        { SEGV_MTEAERR, "asynchronous ARM MTE error" },
                  } },
         { 0,     {
                     { SI_USER, "sent by kill/sigsend/raise" },
                     { SI_KERNEL, "sent by kernel" },
                     { SI_QUEUE, "sent by sigqueue" },
                     { SI_TIMER, "sent by timer expiration" },
                     { SI_MESGQ, "sent by real time mesq state change" },
                     { SI_ASYNCIO, "sent by AIO completion" },
                     { SI_SIGIO, "sent by queued SIGIO" },
                     { SI_TKILL, "sent by tkill syscall" },
                     { SI_DETHREAD, "sent by execve killing subsidiary threads" },
                     { SI_ASYNCNL, "sent by glibc async name lookup completion" },
                     { POLL_IN, "data input available" },
                     { POLL_OUT, "output buffers available" },
                     { POLL_MSG, "input message available" },
                     { POLL_ERR, "I/O error" },
                     { POLL_PRI, "high priority input available" },
                     { POLL_HUP, "device disconnected" },
                  } },
         { SIGILL, {
                      { ILL_ILLOPC, "illegal opcode" },
                      { ILL_ILLOPN, "illegal operand" },
                      { ILL_ILLADR, "illegal address mode" },
                      { ILL_ILLTRP, "illegal trap" },
                      { ILL_PRVOPC, "privileged opcode" },
                      { ILL_PRVREG, "privileged register" },
                      { ILL_COPROC, "coprocessor error" },
                      { ILL_BADSTK, "internal stack error" },
                      { ILL_BADIADDR, "unimplemented instruction address" },
                      /*
                      { __ILL_BREAK, "illegal break" },
                      { __ILL_BNDMOD, "bundle-pudate (modification) in proress" }
                      */
                   } },
         { SIGFPE, {
                      { FPE_INTDIV, "integer divide by zero" },
                      { FPE_INTOVF, "integer overflow" },
                      { FPE_FLTDIV, "floating point divide by zero" },
                      { FPE_FLTOVF, "floating point overflow" },
                      { FPE_FLTUND, "floating point underflow" },
                      { FPE_FLTRES, "floating point inexact result" },
                      { FPE_FLTINV, "floating point invalid operation" },
                      { FPE_FLTSUB, "subscript out of range" },
                      /*
                      { __FPE_DECOVF, "decimal overflow" },
                      { __FPE_DECDIV, "decimal division" },
                      { __FPE_DECERR, "packed decimal error" },
                      { __FPE_INVASC, "invalid ASCII digit" },
                      { __FPE_INVDEC, "invalid decimal digit" },
                      */
                      { FPE_FLTUNK, "undiagnosed floating point exception" },
                      { FPE_CONDTRAP, "trap condition" },
                   } },
         { SIGBUS, {
                      { BUS_ADRALN, "invalid address alignment" },
                      { BUS_ADRERR, "non-existent physical address" },
                      { BUS_OBJERR, "object specific hardware error" },
                      { BUS_MCEERR_AR, "hardware memory error consumed on a machine check: action required" },
                      { BUS_MCEERR_AO, "hardware memory error consumed on a machine check: action optional" },
                   }
         },
         { SIGTRAP, {
                       { TRAP_BRKPT, "process breakpoint" },
                       { TRAP_TRACE, "process trace trap" },
                       { TRAP_BRANCH, "process taken branch trap" },
                       { TRAP_HWBKPT, "hardware breakpoint/watchpoint" },
                       { TRAP_UNK, "undiagnosed trap" },
                       /*
                       { TRAP_PERF, "perf event with sigtrap=1" },
                       */
                    }
         },
         {  SIGSYS, {
                       /*
                       { SYS_SECCOMP, "seccomp triggered" },
                       { SYS_USER_DISPATCH, "syscall user dispatch triggered" }
                       */
                    }
         },
   };

   os << sigdescr_np( si.si_signo )
      << " SIG" << sigabbrev_np( si.si_signo )
      << ", si_code " << si.si_code;

   auto codesforsig = codes.find( si.si_signo );
   if (codesforsig == codes.end()) {
      codesforsig = codes.find( 0 );
   }

   if (codesforsig != codes.end()) {
      auto code = codesforsig->second.find( si.si_code );
      if (code != codesforsig->second.end())
            os << " - " << code->second;
   }

   switch (si.si_signo) {
      case SIGILL:
      case SIGFPE:
      case SIGBUS:
      case SIGTRAP:
#ifdef SIGEMT
      case SIGEMT:
#endif
      case SIGSEGV: {
         os << ", fault address " << std::hex << si.si_addr << std::dec;
         break;
      }


   }
   return os;
}